

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HFSubConsumer::sub_reader(HFSubConsumer *this,zloop_t *loop)

{
  bool bVar1;
  zloop_t *in_RSI;
  void *in_RDI;
  zframe_t *f;
  _zframe_t **in_stack_00000058;
  consumer_token_t *in_stack_00000060;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_00000068;
  zframe_t *local_18;
  zloop_t *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    bVar1 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (!bVar1) break;
    zframe_destroy(&local_18);
    local_18 = (zframe_t *)0x0;
  }
  zloop_reader(local_10,*(zsock_t **)((long)in_RDI + 0xa8),bufferwriter,in_RDI);
  zloop_reader(local_10,*(zsock_t **)((long)in_RDI + 0x388),requesthandler,in_RDI);
  return;
}

Assistant:

void HFSubConsumer::sub_reader(zloop_t *loop){
    zframe_t *f;
    while(framequeue.try_dequeue(replacetoken, f)){
        zframe_destroy(&f);
        f = NULL;
    }
    zloop_reader(loop, sub, bufferwriter, this);
    zloop_reader(loop, rep, requesthandler, this);
}